

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

void spell_ice_blast(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  long lVar1;
  int iVar2;
  int iVar3;
  long in_RCX;
  OBJ_AFFECT_DATA oaf;
  OBJ_DATA *obj_next;
  OBJ_DATA *obj;
  CHAR_DATA *victim;
  undefined1 in_stack_000012b2;
  undefined1 in_stack_000012b3;
  int in_stack_000012b4;
  int in_stack_000012b8;
  int in_stack_000012bc;
  CHAR_DATA *in_stack_000012c0;
  CHAR_DATA *in_stack_000012c8;
  int in_stack_000012e8;
  int in_stack_000012f0;
  char *in_stack_000012f8;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 uVar4;
  int in_stack_ffffffffffffff3c;
  int in_stack_ffffffffffffff40;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffff4c;
  char *in_stack_ffffffffffffff50;
  char *format;
  undefined4 in_stack_ffffffffffffff60;
  long local_30;
  
  act(in_stack_ffffffffffffff50,
      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
      (void *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
      (void *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),0);
  act(in_stack_ffffffffffffff50,
      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
      (void *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
      (void *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),0);
  act(in_stack_ffffffffffffff50,
      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
      (void *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
      (void *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),0);
  dice(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  uVar4 = 0;
  uVar5 = 0;
  uVar6 = 1;
  format = (char *)0x0;
  damage_new(in_stack_000012c8,in_stack_000012c0,in_stack_000012bc,in_stack_000012b8,
             in_stack_000012b4,(bool)in_stack_000012b3,(bool)in_stack_000012b2,in_stack_000012e8,
             in_stack_000012f0,in_stack_000012f8);
  local_30 = *(long *)(in_RCX + 0x98);
  while (local_30 != 0) {
    lVar1 = *(long *)(local_30 + 8);
    iVar2 = (int)*(short *)(local_30 + 0x98);
    local_30 = lVar1;
    if (iVar2 == 10) {
      iVar3 = number_percent();
      if (iVar3 < 0x2e) {
        act(format,(CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff4c,uVar6),
            (void *)CONCAT44(in_stack_ffffffffffffff44,uVar5),
            (void *)CONCAT44(in_stack_ffffffffffffff3c,uVar4),0);
        extract_obj((OBJ_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffff60));
      }
    }
    else if (iVar2 == 0xf) {
      iVar2 = number_percent();
      if (iVar2 < 0x10) {
        act(format,(CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff4c,uVar6),
            (void *)CONCAT44(in_stack_ffffffffffffff44,uVar5),
            (void *)CONCAT44(in_stack_ffffffffffffff3c,uVar4),0);
        init_affect_obj((OBJ_AFFECT_DATA *)0x6e6539);
        affect_to_obj((OBJ_DATA *)CONCAT44(in_stack_ffffffffffffff44,uVar5),
                      (OBJ_AFFECT_DATA *)CONCAT44(in_stack_ffffffffffffff3c,uVar4));
      }
    }
    else if ((iVar2 == 0x11) && (iVar3 = number_percent(), iVar3 < 0x4c)) {
      act(format,(CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff4c,uVar6),
          (void *)CONCAT44(in_stack_ffffffffffffff44,uVar5),
          (void *)CONCAT44(in_stack_ffffffffffffff3c,uVar4),0);
      extract_obj((OBJ_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffff60));
    }
  }
  return;
}

Assistant:

void spell_ice_blast(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	OBJ_DATA *obj, *obj_next;
	OBJ_AFFECT_DATA oaf;

	act("You extend an arm toward $N and send forth a frigid blast!", ch, 0, victim, TO_CHAR);
	act("$n extends an arm toward you and sends forth a frigid blast!", ch, 0, victim, TO_VICT);
	act("$n extends an arm toward $N and sends forth a frigid blast!", ch, 0, victim, TO_NOTVICT);

	damage_new(ch, victim, dice(level, 3), gsn_ice_blast, DAM_COLD, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, nullptr);

	for (obj = victim->carrying; obj; obj = obj_next)
	{
		obj_next = obj->next_content;

		switch (obj->item_type)
		{
			case ITEM_DRINK_CON:
				if (number_percent() <= 75)
				{
					act("$p freezes and shatters!", victim, obj, 0, TO_ALL);
					extract_obj(obj);
				}

				break;
			case ITEM_POTION:
				if (number_percent() <= 45)
				{
					act("$p freezes and shatters!", victim, obj, 0, TO_ALL);
					extract_obj(obj);
				}

				break;
			case ITEM_CONTAINER:
				if (number_percent() <= 15)
				{
					act("$p is frozen shut by a thick layer of ice!", victim, obj, 0, TO_ALL);
					init_affect_obj(&oaf);
					oaf.where = TO_OBJ_AFFECTS;
					oaf.aftype = AFT_SPELL;
					oaf.type = gsn_ice_blast;
					oaf.level = level;
					oaf.location = 0;
					oaf.modifier = 0;
					oaf.duration = level / 6;
					oaf.owner = ch;
					oaf.end_fun = container_defrost;
					oaf.tick_fun = nullptr;
					affect_to_obj(obj, &oaf);
				}

				break;
			default:
				continue;
		}
	}
}